

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall
kj::_::BTreeImpl::rotateRight
          (BTreeImpl *this,Parent *left,Parent *right,Parent *parent,uint indexInParent)

{
  bool bVar1;
  uint uVar2;
  uint back;
  size_t mid;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  Fault local_38;
  Fault f;
  DebugExpression<bool> _kjCondition;
  uint indexInParent_local;
  Parent *parent_local;
  Parent *right_local;
  Parent *left_local;
  BTreeImpl *this_local;
  
  f.exception._4_4_ = indexInParent;
  f.exception._2_1_ = Parent::isHalfFull(right);
  f.exception._3_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f.exception + 2));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 3));
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x2ca,FAILED,"right.isHalfFull()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f.exception + 3));
    Debug::Fault::fatal(&local_38);
  }
  f_1.exception._2_1_ = Parent::isMostlyFull(left);
  f_1.exception._3_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 2));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f_1.exception + 3));
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&mid,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x2cb,FAILED,"left.isMostlyFull()","_kjCondition,",
               (DebugExpression<bool> *)((long)&f_1.exception + 3));
    Debug::Fault::fatal((Fault *)&mid);
  }
  amove<kj::_::BTreeImpl::MaybeUint>(right->keys + 1,right->keys,3);
  amove<unsigned_int>(right->children + 1,right->children,4);
  uVar2 = Parent::keyCount(left);
  right->keys[0].i = parent->keys[f.exception._4_4_].i;
  parent->keys[f.exception._4_4_].i = left->keys[uVar2 - 1].i;
  right->children[0] = left->children[uVar2];
  MaybeUint::operator=(left->keys + (uVar2 - 1),(void *)0x0);
  left->children[uVar2] = 0;
  return;
}

Assistant:

void BTreeImpl::rotateRight(Parent& left, Parent& right, Parent& parent, uint indexInParent) {
  // Steal one item from the left node and move it to the right node.

  // Like merge(), this is only called on an exactly-half-empty node.
  KJ_DASSERT(right.isHalfFull());
  KJ_DASSERT(left.isMostlyFull());

  constexpr size_t mid = Parent::NKEYS/2;
  amove(right.keys + 1, right.keys, mid);
  amove(right.children + 1, right.children, mid + 1);

  uint back = left.keyCount() - 1;

  right.keys[0] = parent.keys[indexInParent];
  parent.keys[indexInParent] = left.keys[back];
  right.children[0] = left.children[back + 1];
  left.keys[back] = nullptr;
  left.children[back + 1] = 0;
}